

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::FieldGeneratorBase
          (FieldGeneratorBase *this,FieldDescriptor *descriptor,int fieldOrdinal,Options *options)

{
  FileDescriptor *descriptor_00;
  Options *options_local;
  int fieldOrdinal_local;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  descriptor_00 = FieldDescriptor::file(descriptor);
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,descriptor_00,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__FieldGeneratorBase_006f4e80;
  this->descriptor_ = descriptor;
  this->fieldOrdinal_ = fieldOrdinal;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  SetCommonFieldVariables(this,&this->variables_);
  return;
}

Assistant:

FieldGeneratorBase::FieldGeneratorBase(const FieldDescriptor* descriptor,
                                       int fieldOrdinal, const Options* options)
    : SourceGeneratorBase(descriptor->file(), options),
      descriptor_(descriptor),
      fieldOrdinal_(fieldOrdinal) {
  SetCommonFieldVariables(&variables_);
}